

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void __thiscall
RecursionState::restore_state<WorkerMemory<ImputedData<unsigned_long,double>,double,float>>
          (RecursionState *this,
          WorkerMemory<ImputedData<unsigned_long,_double>,_double,_float> *workspace)

{
  bool bVar1;
  ulong uVar2;
  type pdVar3;
  reference pvVar4;
  reference pvVar5;
  double *pdVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_RDI;
  size_t ix_1;
  size_t ix;
  size_t tot;
  pointer *in_stack_ffffffffffffff88;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff90;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  pointer *this_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  double dVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffb8;
  ulong uVar8;
  
  in_RSI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_RDI._M_current[3];
  in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_RDI._M_current[4];
  bVar1 = ColumnSampler<double>::has_weights((ColumnSampler<double> *)0x5c0233);
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::operator=
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    in_RSI[0x13].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_RDI._M_current[6];
  }
  else {
    in_RSI[0x11].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_RDI._M_current[5];
  }
  if ((*(byte *)((long)in_RDI._M_current + 0x39) & 1) != 0) {
    in_RSI[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*in_RDI._M_current;
    in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_RDI._M_current[1];
    in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_RDI._M_current[2];
    *(byte *)&in_RSI[9].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (byte)in_RDI._M_current[7] & 1;
    bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffffa0);
    if ((bVar1) &&
       (bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffffa0), !bVar1)) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff88)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff88)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff88)
      ;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   *)in_stack_ffffffffffffff98,(difference_type)in_stack_ffffffffffffff90);
      std::
      copy<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_RDI);
      if ((in_RDI._M_current[7] & 1) != 0) {
        uVar2 = (long)in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)in_RSI[4].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
        bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffffa0);
        if (bVar1) {
          for (uVar8 = 0; uVar8 < uVar2; uVar8 = uVar8 + 1) {
            pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                               ((unique_ptr<double[],_std::default_delete<double[]>_> *)
                                in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
            in_stack_ffffffffffffff90 =
                 (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                  *)*pdVar3;
            in_stack_ffffffffffffff88 =
                 &in_RSI[5].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      (in_RSI,uVar8 + (long)in_RSI[4].
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_finish);
            pdVar6 = tsl::
                     robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                     ::operator[](in_stack_ffffffffffffff90,
                                  (unsigned_long *)in_stack_ffffffffffffff88);
            *pdVar6 = (double)in_stack_ffffffffffffff90;
          }
        }
        else {
          for (uVar8 = 0; uVar8 < uVar2; uVar8 = uVar8 + 1) {
            pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                               ((unique_ptr<double[],_std::default_delete<double[]>_> *)
                                in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
            dVar7 = *pdVar3;
            this_00 = &in_RSI[8].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (in_RSI,uVar8 + (long)in_RSI[4].
                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)this_00,*pvVar4);
            *pvVar5 = dVar7;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void RecursionState::restore_state(WorkerMemory &workspace)
{
    workspace.split_ix         =  this->split_ix;
    workspace.end              =  this->end;
    if (!workspace.col_sampler.has_weights())
        workspace.col_sampler.curr_pos = this->sampler_pos;
    else  {
        workspace.col_sampler.tree_weights  =  std::move(this->col_sampler_weights);
        workspace.col_sampler.n_dropped     =  this->n_dropped;
    }

    if (this->full_state)
    {
        workspace.st         =  this->st;
        workspace.st_NA      =  this->st_NA;
        workspace.end_NA     =  this->end_NA;

        workspace.changed_weights = this->changed_weights;

        if (workspace.comb_val.empty() && !this->ix_arr.empty())
        {
            std::copy(this->ix_arr.begin(),
                      this->ix_arr.end(),
                      workspace.ix_arr.begin() + this->st_NA);
            if (this->changed_weights)
            {
                size_t tot = workspace.end_NA - workspace.st_NA;
                if (!workspace.weights_arr.empty())
                    for (size_t ix = 0; ix < tot; ix++)
                        workspace.weights_arr[workspace.ix_arr[ix + workspace.st_NA]] = this->weights_arr[ix];
                else
                    for (size_t ix = 0; ix < tot; ix++)
                        workspace.weights_map[workspace.ix_arr[ix + workspace.st_NA]] = this->weights_arr[ix];
            }
        }
    }
}